

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::stop(AsyncQueue<nrg::PrioExecution> *this)

{
  anon_class_8_1_8991fb9c local_38;
  undefined1 local_30 [8];
  Function fn;
  AsyncQueue<nrg::PrioExecution> *this_local;
  
  local_38.this = this;
  fn._M_invoker = (_Invoker_type)this;
  std::function<void()>::
  function<nrg::detail::AsyncQueue<nrg::PrioExecution>::stop()::_lambda()_1_,void>
            ((function<void()> *)local_30,&local_38);
  operator()(this,(function<void_()> *)local_30);
  std::function<void_()>::~function((function<void_()> *)local_30);
  return;
}

Assistant:

void stop()
    {
        typename AsyncStyle::Function fn([this]() {running_ = false; });
        (*this)(std::move(fn));
    }